

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_change_effects(textblock *tb,player_shape *s)

{
  textblock *tba;
  textblock *tbe;
  player_shape *s_local;
  textblock *tb_local;
  
  tba = effect_describe(s->effect,"Changing into the shape ",0,false);
  if (tba != (textblock *)0x0) {
    textblock_append_textblock(tb,tba);
    textblock_free(tba);
    textblock_append(tb,".\n");
  }
  return;
}

Assistant:

static void shape_lore_append_change_effects(textblock *tb,
	const struct player_shape *s)
{
	textblock *tbe = effect_describe(s->effect, "Changing into the shape ",
		0, false);

	if (tbe) {
		textblock_append_textblock(tb, tbe);
		textblock_free(tbe);
		textblock_append(tb, ".\n");
	}
}